

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_failed
          (Impl *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *failed,size_t *count,Hash *hashes)

{
  __node_base *p_Var1;
  
  if (hashes == (Hash *)0x0) {
    *count = (failed->_M_h)._M_element_count;
  }
  else {
    if (*count != (failed->_M_h)._M_element_count) {
      return false;
    }
    p_Var1 = &(failed->_M_h)._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      *hashes = (Hash)p_Var1[1]._M_nxt;
      hashes = hashes + 1;
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::unordered_set<Hash> &failed, size_t *count, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
			*hashes++ = mod;
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}